

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.h
# Opt level: O3

void __thiscall
CGL::DrawRend::DrawRend(DrawRend *this,vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *svgs_)

{
  *(undefined ***)this = &PTR__DrawRend_002280c8;
  std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::vector(&this->svgs,svgs_);
  (this->svg_to_ndc).super__Vector_base<CGL::Matrix3x3,_std::allocator<CGL::Matrix3x3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->svg_to_ndc).super__Vector_base<CGL::Matrix3x3,_std::allocator<CGL::Matrix3x3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->current_svg = 0;
  (this->svg_to_ndc).super__Vector_base<CGL::Matrix3x3,_std::allocator<CGL::Matrix3x3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Matrix3x3::Matrix3x3(&this->ndc_to_screen);
  (this->framebuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->framebuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->samplebuffer).
  super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samplebuffer).
  super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samplebuffer).
  super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DrawRend(std::vector<SVG*> svgs_):
  svgs(svgs_), current_svg(0)
  {}